

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

date_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMonthsBinaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t>
          (WidthConvertibleToMonthsBinaryOperator *this,interval_t bucket_width,date_t ts)

{
  bool bVar1;
  int32_t left;
  int iVar2;
  int iVar3;
  date_t dVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [12];
  date_t result;
  date_t local_3c;
  string local_38;
  
  dVar4.days = bucket_width.micros._0_4_;
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(dVar4);
  if (!bVar1) {
    bVar1 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::date_t>(dVar4,&local_3c,false);
    if (bVar1) {
      return (date_t)local_3c.days;
    }
    auVar7 = __cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::date_t,duckdb::date_t>
              (&local_38,(duckdb *)(ulong)(uint)dVar4.days,(date_t)auVar7._8_4_);
    duckdb::InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_38);
    __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  left = EpochMonths<duckdb::date_t>(dVar4);
  iVar5 = (int)this;
  iVar6 = (int)(0x168 % (long)iVar5);
  iVar2 = SubtractOperatorOverflowCheck::Operation<int,int,int>(left,iVar6);
  iVar3 = iVar2 - iVar2 % iVar5;
  if (iVar2 % iVar5 != 0 && iVar2 < 0) {
    iVar3 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar3,iVar5);
  }
  iVar3 = iVar3 + iVar6;
  iVar2 = iVar3 % 0xc;
  if (iVar2 == 0 || -1 < iVar3) {
    iVar6 = iVar3 / 0xc + 0x7b2;
    iVar5 = 1;
    if (-1 < iVar3) goto LAB_006236f7;
  }
  else {
    iVar6 = 0x7b1 - (uint)-iVar3 / 0xc;
  }
  iVar5 = 0xd;
  if (iVar2 == 0) {
    iVar5 = 1;
  }
LAB_006236f7:
  dVar4.days = duckdb::Date::FromDate(iVar6,iVar5 + iVar2,1);
  bVar1 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::date_t>(dVar4,&local_3c,false);
  if (bVar1) {
    return (date_t)local_3c.days;
  }
  auVar7 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::date_t>
            (&local_38,(duckdb *)(ulong)(uint)dVar4.days,(date_t)auVar7._8_4_);
  duckdb::InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_38);
  __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS));
		}